

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3InsertTerms(Fts3Table *p,int iLangid,sqlite3_value **apVal,u32 *aSz)

{
  int iVar1;
  char *zText;
  int iCol;
  long lVar2;
  long lVar3;
  u32 *pnWord;
  
  iVar1 = p->nColumn;
  if (iVar1 < 1) {
    return 0;
  }
  lVar2 = 0;
  pnWord = aSz;
  do {
    if (p->abNotindexed[lVar2] == '\0') {
      zText = (char *)sqlite3ValueText(apVal[lVar2 + 2],'\x01');
      iVar1 = fts3PendingTermsAdd(p,iLangid,zText,(int)lVar2,pnWord);
      if (iVar1 != 0) {
        return iVar1;
      }
      iVar1 = sqlite3ValueBytes(apVal[lVar2 + 2],'\x01');
      aSz[p->nColumn] = aSz[p->nColumn] + iVar1;
      iVar1 = p->nColumn;
    }
    lVar3 = lVar2 + 2;
    pnWord = pnWord + 1;
    lVar2 = lVar2 + 1;
  } while (lVar3 <= iVar1);
  return 0;
}

Assistant:

static int fts3InsertTerms(
  Fts3Table *p,
  int iLangid,
  sqlite3_value **apVal,
  u32 *aSz
){
  int i;                          /* Iterator variable */
  for(i=2; i<p->nColumn+2; i++){
    int iCol = i-2;
    if( p->abNotindexed[iCol]==0 ){
      const char *zText = (const char *)sqlite3_value_text(apVal[i]);
      int rc = fts3PendingTermsAdd(p, iLangid, zText, iCol, &aSz[iCol]);
      if( rc!=SQLITE_OK ){
        return rc;
      }
      aSz[p->nColumn] += sqlite3_value_bytes(apVal[i]);
    }
  }
  return SQLITE_OK;
}